

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_keep_alive_handler(http_context_t *context)

{
  http_string_t hVar1;
  http_string_t connection;
  http_context_t *context_local;
  
  if (context->version == HTTP_1_1) {
    hVar1 = get_request_header(context,"Connection");
    connection.value = (char *)hVar1.len;
    if ((char *)0x5 < connection.value) {
      context->session->flags = context->session->flags | 2;
      set_response_header(context,"Connection","keep-alive");
      return;
    }
  }
  context->session->flags = context->session->flags & 0xfd;
  set_response_header(context,"Connection","close");
  return;
}

Assistant:

void nh_keep_alive_handler(http_context_t *context) {
    // just for keep alive now
    if (context->version == HTTP_1_1) {
        http_string_t connection = get_request_header(context, "Connection");
        if (connection.len > 5) {
            // not "close"
            FLAG_SET(context->session->flags, SESSION_FLAG_KEEP_ALIVE);
            set_response_header(context, "Connection", "keep-alive");
            return;
        }
    }
    FLAG_CLEAR(context->session->flags, SESSION_FLAG_KEEP_ALIVE);
    set_response_header(context, "Connection", "close");
}